

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-builder.h
# Opt level: O2

Load * __thiscall
wasm::Builder::makeLoad
          (Builder *this,uint bytes,bool signed_,Address offset,uint align,Expression *ptr,Type type
          ,Name memory)

{
  Load *pLVar1;
  
  pLVar1 = MixedArena::alloc<wasm::Load>(&this->wasm->allocator);
  pLVar1->isAtomic = false;
  pLVar1->bytes = (uint8_t)bytes;
  pLVar1->signed_ = signed_;
  (pLVar1->offset).addr = offset.addr;
  (pLVar1->align).addr = (ulong)align;
  pLVar1->ptr = ptr;
  (pLVar1->super_SpecificExpression<(wasm::Expression::Id)12>).super_Expression.type.id = type.id;
  (pLVar1->memory).super_IString.str._M_len = memory.super_IString.str._M_len;
  (pLVar1->memory).super_IString.str._M_str = memory.super_IString.str._M_str;
  wasm::Load::finalize();
  return pLVar1;
}

Assistant:

Load* makeLoad(unsigned bytes,
                 bool signed_,
                 Address offset,
                 unsigned align,
                 Expression* ptr,
                 Type type,
                 Name memory) {
    auto* ret = wasm.allocator.alloc<Load>();
    ret->isAtomic = false;
    ret->bytes = bytes;
    ret->signed_ = signed_;
    ret->offset = offset;
    ret->align = align;
    ret->ptr = ptr;
    ret->type = type;
    ret->memory = memory;
    ret->finalize();
    return ret;
  }